

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bplustree.cpp
# Opt level: O0

int __thiscall BPlusTree::GetHeight(BPlusTree *this)

{
  bool bVar1;
  element_type *peVar2;
  shared_ptr<Node> local_40;
  undefined1 local_30 [8];
  shared_ptr<Node> traverseNode;
  int height;
  BPlusTree *this_local;
  
  traverseNode.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 0;
  bVar1 = std::operator==(&this->root,(nullptr_t)0x0);
  if (bVar1) {
    this_local._4_4_ = 0;
  }
  else {
    peVar2 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this)
    ;
    std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::operator[]
              (&peVar2->ptrs,0);
    std::static_pointer_cast<Node,void>((shared_ptr<void> *)local_30);
    while (bVar1 = std::operator!=((shared_ptr<Node> *)local_30,(nullptr_t)0x0), bVar1) {
      traverseNode.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
           traverseNode.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
           + 1;
      peVar2 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          local_30);
      if ((peVar2->isLeaf & 1U) != 0) break;
      peVar2 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          local_30);
      std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::operator[]
                (&peVar2->ptrs,0);
      std::static_pointer_cast<Node,void>((shared_ptr<void> *)&local_40);
      std::shared_ptr<Node>::operator=((shared_ptr<Node> *)local_30,&local_40);
      std::shared_ptr<Node>::~shared_ptr(&local_40);
    }
    std::shared_ptr<Node>::~shared_ptr((shared_ptr<Node> *)local_30);
    this_local._4_4_ =
         traverseNode.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_;
  }
  return this_local._4_4_;
}

Assistant:

int BPlusTree::GetHeight() {
    int height = 0;
    if (root == nullptr) {
        return 0;
    } else {
        std::shared_ptr<Node> traverseNode = std::static_pointer_cast<Node>(root->ptrs[0]);
        while (traverseNode != nullptr) {
            height++;
            if (traverseNode->isLeaf) {
                break;
            } else {
                traverseNode = std::static_pointer_cast<Node>(traverseNode->ptrs[0]);
            }
        }
    }
    return height;
}